

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  vfloat<4> vVar3;
  BVH *bvh;
  size_t sVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  size_t sVar21;
  bool bVar22;
  uint uVar23;
  undefined4 uVar24;
  int iVar25;
  long lVar26;
  uint uVar27;
  size_t sVar28;
  long lVar29;
  ulong uVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  NodeRef root;
  long lVar32;
  NodeRef *pNVar33;
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  float fVar57;
  float fVar58;
  float fVar63;
  float fVar65;
  vint4 bi_1;
  undefined1 auVar59 [16];
  float fVar67;
  undefined1 auVar60 [16];
  float fVar64;
  float fVar66;
  float fVar68;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 bi_3;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 bi_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar86;
  float fVar87;
  float fVar88;
  vint4 ai;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  uint uVar99;
  uint uVar100;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint uVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  vint4 ai_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  vint4 ai_3;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar120;
  undefined1 auVar116 [16];
  float fVar118;
  float fVar119;
  undefined1 auVar117 [64];
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar129;
  undefined1 auVar125 [16];
  float fVar127;
  float fVar128;
  undefined1 auVar126 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_1948 [16];
  undefined1 local_1918 [8];
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined1 local_18f8 [8];
  float fStack_18f0;
  float fStack_18ec;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float local_18a8;
  float fStack_18a4;
  float fStack_18a0;
  float fStack_189c;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar62 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar70 = vpcmpeqd_avx(auVar62,(undefined1  [16])valid_i->field_0);
    auVar40 = ZEXT816(0) << 0x40;
    auVar5 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40,5);
    auVar76 = auVar70 & auVar5;
    if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar76[0xf] < '\0')
    {
      auVar5 = vandps_avx(auVar5,auVar70);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar108._8_4_ = 0x7fffffff;
      auVar108._0_8_ = 0x7fffffff7fffffff;
      auVar108._12_4_ = 0x7fffffff;
      auVar70 = vandps_avx(auVar108,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar102._8_4_ = 0x219392ef;
      auVar102._0_8_ = 0x219392ef219392ef;
      auVar102._12_4_ = 0x219392ef;
      auVar70 = vcmpps_avx(auVar70,auVar102,1);
      auVar76 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar102,auVar70)
      ;
      auVar70 = vandps_avx(auVar108,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar70 = vcmpps_avx(auVar70,auVar102,1);
      auVar81 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar102,auVar70)
      ;
      auVar70 = vandps_avx(auVar108,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar70 = vcmpps_avx(auVar70,auVar102,1);
      auVar70 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar102,auVar70)
      ;
      auVar75 = vrcpps_avx(auVar76);
      fVar6 = auVar75._0_4_;
      auVar69._0_4_ = auVar76._0_4_ * fVar6;
      fVar7 = auVar75._4_4_;
      auVar69._4_4_ = auVar76._4_4_ * fVar7;
      fVar8 = auVar75._8_4_;
      auVar69._8_4_ = auVar76._8_4_ * fVar8;
      fVar9 = auVar75._12_4_;
      auVar69._12_4_ = auVar76._12_4_ * fVar9;
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar76 = vsubps_avx(auVar103,auVar69);
      tray.rdir.field_0._0_4_ = fVar6 + fVar6 * auVar76._0_4_;
      tray.rdir.field_0._4_4_ = fVar7 + fVar7 * auVar76._4_4_;
      tray.rdir.field_0._8_4_ = fVar8 + fVar8 * auVar76._8_4_;
      tray.rdir.field_0._12_4_ = fVar9 + fVar9 * auVar76._12_4_;
      auVar76 = vrcpps_avx(auVar81);
      fVar6 = auVar76._0_4_;
      auVar75._0_4_ = auVar81._0_4_ * fVar6;
      fVar7 = auVar76._4_4_;
      auVar75._4_4_ = auVar81._4_4_ * fVar7;
      fVar8 = auVar76._8_4_;
      auVar75._8_4_ = auVar81._8_4_ * fVar8;
      fVar9 = auVar76._12_4_;
      auVar75._12_4_ = auVar81._12_4_ * fVar9;
      auVar76 = vsubps_avx(auVar103,auVar75);
      tray.rdir.field_0._16_4_ = fVar6 + fVar6 * auVar76._0_4_;
      tray.rdir.field_0._20_4_ = fVar7 + fVar7 * auVar76._4_4_;
      tray.rdir.field_0._24_4_ = fVar8 + fVar8 * auVar76._8_4_;
      tray.rdir.field_0._28_4_ = fVar9 + fVar9 * auVar76._12_4_;
      auVar76 = vrcpps_avx(auVar70);
      fVar6 = auVar76._0_4_;
      auVar81._0_4_ = auVar70._0_4_ * fVar6;
      fVar7 = auVar76._4_4_;
      auVar81._4_4_ = auVar70._4_4_ * fVar7;
      fVar8 = auVar76._8_4_;
      auVar81._8_4_ = auVar70._8_4_ * fVar8;
      fVar9 = auVar76._12_4_;
      auVar81._12_4_ = auVar70._12_4_ * fVar9;
      auVar70 = vsubps_avx(auVar103,auVar81);
      tray.rdir.field_0._32_4_ = fVar6 + fVar6 * auVar70._0_4_;
      tray.rdir.field_0._36_4_ = fVar7 + fVar7 * auVar70._4_4_;
      tray.rdir.field_0._40_4_ = fVar8 + fVar8 * auVar70._8_4_;
      tray.rdir.field_0._44_4_ = fVar9 + fVar9 * auVar70._12_4_;
      auVar70 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar40,1);
      auVar90._8_4_ = 0x10;
      auVar90._0_8_ = 0x1000000010;
      auVar90._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar70,auVar90);
      auVar70 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar40,5);
      auVar76._8_4_ = 0x20;
      auVar76._0_8_ = 0x2000000020;
      auVar76._12_4_ = 0x20;
      auVar91._8_4_ = 0x30;
      auVar91._0_8_ = 0x3000000030;
      auVar91._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar91,auVar76,auVar70);
      auVar70 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar40,5);
      auVar82._8_4_ = 0x40;
      auVar82._0_8_ = 0x4000000040;
      auVar82._12_4_ = 0x40;
      auVar92._8_4_ = 0x50;
      auVar92._0_8_ = 0x5000000050;
      auVar92._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar92,auVar82,auVar70);
      auVar70 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar40);
      auVar76 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar117 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar70,auVar5);
      auVar56 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar70._8_4_ = 0xff800000;
      auVar70._0_8_ = 0xff800000ff800000;
      auVar70._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar70,auVar76,auVar5);
      terminated.field_0.i[1] = auVar5._4_4_ ^ auVar62._4_4_;
      terminated.field_0.i[0] = auVar5._0_4_ ^ auVar62._0_4_;
      terminated.field_0.i[2] = auVar5._8_4_ ^ auVar62._8_4_;
      terminated.field_0.i[3] = auVar5._12_4_ ^ auVar62._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar27 = 3;
      }
      else {
        uVar27 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar31 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ebd965:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ebe34b;
          pNVar33 = pNVar33 + -1;
          paVar31 = paVar31 + -1;
          vVar3.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v;
          auVar126 = ZEXT1664((undefined1  [16])vVar3.field_0);
          auVar62 = vcmpps_avx((undefined1  [16])vVar3.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar23 = vmovmskps_avx(auVar62);
        } while (uVar23 == 0);
        uVar30 = (ulong)(uVar23 & 0xff);
        uVar23 = POPCOUNT(uVar23 & 0xff);
        if (uVar27 < uVar23) {
LAB_00ebd9a4:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ebe34b;
              auVar62 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar126._0_16_,6);
              if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar62[0xf]) goto LAB_00ebd965;
              local_1948._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_1948._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_1948._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              uVar13 = *(undefined8 *)(ray + 0x40);
              auVar20 = *(undefined1 (*) [12])(ray + 0x40);
              local_1898 = (float)uVar13;
              fStack_1894 = (float)((ulong)uVar13 >> 0x20);
              fStack_1890 = (float)*(undefined8 *)(ray + 0x48);
              fStack_188c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
              lVar32 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              lVar26 = 0;
              goto LAB_00ebdc1d;
            }
            sVar28 = 8;
            auVar62 = auVar117._0_16_;
            for (lVar26 = 0;
                (auVar126 = ZEXT1664(auVar62), lVar26 != 4 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar26 * 8), sVar4 != 8));
                lVar26 = lVar26 + 1) {
              uVar24 = *(undefined4 *)(root.ptr + 0x20 + lVar26 * 4);
              auVar34._4_4_ = uVar24;
              auVar34._0_4_ = uVar24;
              auVar34._8_4_ = uVar24;
              auVar34._12_4_ = uVar24;
              auVar14._8_8_ = tray.org.field_0._8_8_;
              auVar14._0_8_ = tray.org.field_0._0_8_;
              auVar15._8_8_ = tray.org.field_0._24_8_;
              auVar15._0_8_ = tray.org.field_0._16_8_;
              auVar16._8_8_ = tray.org.field_0._40_8_;
              auVar16._0_8_ = tray.org.field_0._32_8_;
              auVar70 = vsubps_avx(auVar34,auVar14);
              auVar83._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar70._0_4_;
              auVar83._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar70._4_4_;
              auVar83._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar70._8_4_;
              auVar83._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar70._12_4_;
              uVar24 = *(undefined4 *)(root.ptr + 0x40 + lVar26 * 4);
              auVar35._4_4_ = uVar24;
              auVar35._0_4_ = uVar24;
              auVar35._8_4_ = uVar24;
              auVar35._12_4_ = uVar24;
              auVar70 = vsubps_avx(auVar35,auVar15);
              auVar104._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
              auVar104._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
              auVar104._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
              auVar104._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
              uVar24 = *(undefined4 *)(root.ptr + 0x60 + lVar26 * 4);
              auVar36._4_4_ = uVar24;
              auVar36._0_4_ = uVar24;
              auVar36._8_4_ = uVar24;
              auVar36._12_4_ = uVar24;
              auVar70 = vsubps_avx(auVar36,auVar16);
              auVar109._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
              auVar109._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
              auVar109._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
              auVar109._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
              uVar24 = *(undefined4 *)(root.ptr + 0x30 + lVar26 * 4);
              auVar37._4_4_ = uVar24;
              auVar37._0_4_ = uVar24;
              auVar37._8_4_ = uVar24;
              auVar37._12_4_ = uVar24;
              auVar70 = vsubps_avx(auVar37,auVar14);
              auVar46._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar70._0_4_;
              auVar46._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar70._4_4_;
              auVar46._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar70._8_4_;
              auVar46._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar70._12_4_;
              uVar24 = *(undefined4 *)(root.ptr + 0x50 + lVar26 * 4);
              auVar38._4_4_ = uVar24;
              auVar38._0_4_ = uVar24;
              auVar38._8_4_ = uVar24;
              auVar38._12_4_ = uVar24;
              auVar70 = vsubps_avx(auVar38,auVar15);
              auVar59._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
              auVar59._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
              auVar59._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
              auVar59._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
              uVar24 = *(undefined4 *)(root.ptr + 0x70 + lVar26 * 4);
              auVar39._4_4_ = uVar24;
              auVar39._0_4_ = uVar24;
              auVar39._8_4_ = uVar24;
              auVar39._12_4_ = uVar24;
              auVar70 = vsubps_avx(auVar39,auVar16);
              auVar71._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
              auVar71._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
              auVar71._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
              auVar71._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
              auVar70 = vpminsd_avx(auVar83,auVar46);
              auVar76 = vpminsd_avx(auVar104,auVar59);
              auVar70 = vpmaxsd_avx(auVar70,auVar76);
              auVar76 = vpminsd_avx(auVar109,auVar71);
              auVar40 = vpmaxsd_avx(auVar70,auVar76);
              auVar70 = vpmaxsd_avx(auVar83,auVar46);
              auVar76 = vpmaxsd_avx(auVar104,auVar59);
              auVar76 = vpminsd_avx(auVar70,auVar76);
              auVar70 = vpmaxsd_avx(auVar109,auVar71);
              auVar76 = vpminsd_avx(auVar76,auVar70);
              auVar70 = vpmaxsd_avx(auVar40,(undefined1  [16])tray.tnear.field_0);
              auVar76 = vpminsd_avx(auVar76,(undefined1  [16])tray.tfar.field_0);
              auVar76 = vcmpps_avx(auVar70,auVar76,2);
              auVar56 = ZEXT1664(auVar76);
              sVar21 = sVar28;
              auVar70 = auVar62;
              if (((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar76[0xf] < '\0') &&
                 (auVar70 = vblendvps_avx(auVar117._0_16_,auVar40,auVar76), sVar21 = sVar4,
                 sVar28 != 8)) {
                pNVar33->ptr = sVar28;
                pNVar33 = pNVar33 + 1;
                *(undefined1 (*) [16])paVar31->v = auVar62;
                paVar31 = paVar31 + 1;
              }
              auVar62 = auVar70;
              sVar28 = sVar21;
            }
            if (sVar28 == 8) goto LAB_00ebdb26;
            auVar70 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar62,6);
            uVar24 = vmovmskps_avx(auVar70);
            root.ptr = sVar28;
          } while ((byte)uVar27 < (byte)POPCOUNT(uVar24));
          pNVar33->ptr = sVar28;
          pNVar33 = pNVar33 + 1;
          *(undefined1 (*) [16])paVar31->v = auVar62;
          paVar31 = paVar31 + 1;
LAB_00ebdb26:
          iVar25 = 4;
        }
        else {
          while (uVar30 != 0) {
            sVar28 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> sVar28 & 1) == 0; sVar28 = sVar28 + 1) {
              }
            }
            uVar30 = uVar30 & uVar30 - 1;
            bVar22 = occluded1(This,bvh,root,sVar28,&pre,ray,&tray,context);
            if (bVar22) {
              terminated.field_0.i[sVar28] = -1;
            }
          }
          auVar62 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar25 = 3;
          auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar126 = ZEXT1664((undefined1  [16])vVar3.field_0);
          if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar62[0xf] < '\0') {
            auVar56 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar62._8_4_ = 0xff800000;
            auVar62._0_8_ = 0xff800000ff800000;
            auVar62._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar62,
                               (undefined1  [16])terminated.field_0);
            iVar25 = 2;
          }
          if (uVar27 < uVar23) goto LAB_00ebd9a4;
        }
      } while (iVar25 != 3);
LAB_00ebe34b:
      auVar5 = vandps_avx(auVar5,(undefined1  [16])terminated.field_0);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      auVar5 = vmaskmovps_avx(auVar5,auVar55);
      *(undefined1 (*) [16])(ray + 0x80) = auVar5;
    }
  }
  return;
LAB_00ebdc1d:
  do {
    auVar62 = auVar56._0_16_;
    if (lVar26 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    lVar29 = -0x10;
    auVar70 = local_1948;
    do {
      if ((lVar29 == 0) || (uVar30 = (ulong)*(uint *)(lVar32 + 0x10 + lVar29), uVar30 == 0xffffffff)
         ) break;
      fVar6 = *(float *)(lVar32 + -0xb0 + lVar29);
      auVar84._4_4_ = fVar6;
      auVar84._0_4_ = fVar6;
      auVar84._8_4_ = fVar6;
      auVar84._12_4_ = fVar6;
      fVar7 = *(float *)(lVar32 + -0xa0 + lVar29);
      auVar40._4_4_ = fVar7;
      auVar40._0_4_ = fVar7;
      auVar40._8_4_ = fVar7;
      auVar40._12_4_ = fVar7;
      fVar8 = *(float *)(lVar32 + -0x90 + lVar29);
      auVar77._4_4_ = fVar8;
      auVar77._0_4_ = fVar8;
      auVar77._8_4_ = fVar8;
      auVar77._12_4_ = fVar8;
      local_18f8._4_4_ = *(float *)(lVar32 + -0x80 + lVar29);
      local_1908._4_4_ = *(float *)(lVar32 + -0x70 + lVar29);
      local_1918._4_4_ = *(float *)(lVar32 + -0x60 + lVar29);
      fVar9 = *(float *)(lVar32 + -0x20 + lVar29);
      fVar1 = *(float *)(lVar32 + -0x10 + lVar29);
      fVar2 = *(float *)(lVar32 + lVar29);
      local_18f8._0_4_ = local_18f8._4_4_;
      fStack_18f0 = (float)local_18f8._4_4_;
      fStack_18ec = (float)local_18f8._4_4_;
      fVar10 = fVar6 - (float)local_18f8._4_4_;
      local_1908._0_4_ = local_1908._4_4_;
      fStack_1900 = (float)local_1908._4_4_;
      fStack_18fc = (float)local_1908._4_4_;
      fVar11 = fVar7 - (float)local_1908._4_4_;
      local_1918._0_4_ = local_1918._4_4_;
      fStack_1910 = (float)local_1918._4_4_;
      fStack_190c = (float)local_1918._4_4_;
      fVar12 = fVar8 - (float)local_1918._4_4_;
      fVar7 = fVar1 - fVar7;
      fVar8 = fVar2 - fVar8;
      fVar6 = fVar9 - fVar6;
      auVar62 = vsubps_avx(auVar40,*(undefined1 (*) [16])(ray + 0x10));
      auVar76 = vsubps_avx(auVar77,*(undefined1 (*) [16])(ray + 0x20));
      local_1878 = (float)*(undefined8 *)(ray + 0x50);
      fStack_1874 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_1870 = (float)*(undefined8 *)(ray + 0x58);
      fStack_186c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      fVar66 = auVar76._0_4_;
      auVar114._0_4_ = fVar66 * local_1878;
      fVar68 = auVar76._4_4_;
      auVar114._4_4_ = fVar68 * fStack_1874;
      fVar80 = auVar76._8_4_;
      auVar114._8_4_ = fVar80 * fStack_1870;
      fVar87 = auVar76._12_4_;
      auVar114._12_4_ = fVar87 * fStack_186c;
      local_1888 = (float)*(undefined8 *)(ray + 0x60);
      fStack_1884 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_1880 = (float)*(undefined8 *)(ray + 0x68);
      fStack_187c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar57 = auVar62._0_4_;
      auVar122._0_4_ = fVar57 * local_1888;
      fVar63 = auVar62._4_4_;
      auVar122._4_4_ = fVar63 * fStack_1884;
      fVar65 = auVar62._8_4_;
      auVar122._8_4_ = fVar65 * fStack_1880;
      fVar67 = auVar62._12_4_;
      auVar122._12_4_ = fVar67 * fStack_187c;
      auVar82 = vsubps_avx(auVar122,auVar114);
      auVar62 = vsubps_avx(auVar84,*(undefined1 (*) [16])ray);
      fVar79 = auVar62._0_4_;
      auVar115._0_4_ = fVar79 * local_1888;
      fVar86 = auVar62._4_4_;
      auVar115._4_4_ = fVar86 * fStack_1884;
      fVar58 = auVar62._8_4_;
      auVar115._8_4_ = fVar58 * fStack_1880;
      fVar64 = auVar62._12_4_;
      auVar115._12_4_ = fVar64 * fStack_187c;
      auVar123._0_4_ = fVar66 * local_1898;
      auVar123._4_4_ = fVar68 * fStack_1894;
      auVar123._8_4_ = fVar80 * fStack_1890;
      auVar123._12_4_ = fVar87 * fStack_188c;
      auVar90 = vsubps_avx(auVar123,auVar115);
      auVar124._0_4_ = fVar57 * local_1898;
      auVar124._4_4_ = fVar63 * fStack_1894;
      auVar124._8_4_ = fVar65 * fStack_1890;
      auVar124._12_4_ = fVar67 * fStack_188c;
      auVar130._0_4_ = fVar79 * local_1878;
      auVar130._4_4_ = fVar86 * fStack_1874;
      auVar130._8_4_ = fVar58 * fStack_1870;
      auVar130._12_4_ = fVar64 * fStack_186c;
      auVar91 = vsubps_avx(auVar130,auVar124);
      auVar62 = ZEXT416((uint)(fVar10 * fVar8 - fVar6 * fVar12));
      auVar76 = vshufps_avx(auVar62,auVar62,0);
      auVar62 = ZEXT416((uint)(fVar6 * fVar11 - fVar7 * fVar10));
      auVar40 = vshufps_avx(auVar62,auVar62,0);
      auVar92 = vpermilps_avx(ZEXT416((uint)(fVar7 * fVar12 - fVar11 * fVar8)),0);
      auVar131._0_4_ =
           auVar92._0_4_ * local_1898 + auVar40._0_4_ * local_1888 + auVar76._0_4_ * local_1878;
      auVar131._4_4_ =
           auVar92._4_4_ * fStack_1894 + auVar40._4_4_ * fStack_1884 + auVar76._4_4_ * fStack_1874;
      auVar131._8_4_ =
           auVar92._8_4_ * fStack_1890 + auVar40._8_4_ * fStack_1880 + auVar76._8_4_ * fStack_1870;
      auVar131._12_4_ =
           auVar92._12_4_ * fStack_188c +
           auVar40._12_4_ * fStack_187c + auVar76._12_4_ * fStack_186c;
      auVar81 = vshufps_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),0);
      auVar75 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
      auVar69 = vshufps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),0);
      auVar93._8_4_ = 0x80000000;
      auVar93._0_8_ = 0x8000000080000000;
      auVar93._12_4_ = 0x80000000;
      auVar62 = vandps_avx(auVar131,auVar93);
      uVar23 = auVar62._0_4_;
      auVar134._0_4_ =
           uVar23 ^ (uint)(auVar69._0_4_ * auVar82._0_4_ +
                          auVar90._0_4_ * auVar81._0_4_ + auVar91._0_4_ * auVar75._0_4_);
      uVar99 = auVar62._4_4_;
      auVar134._4_4_ =
           uVar99 ^ (uint)(auVar69._4_4_ * auVar82._4_4_ +
                          auVar90._4_4_ * auVar81._4_4_ + auVar91._4_4_ * auVar75._4_4_);
      uVar100 = auVar62._8_4_;
      auVar134._8_4_ =
           uVar100 ^ (uint)(auVar69._8_4_ * auVar82._8_4_ +
                           auVar90._8_4_ * auVar81._8_4_ + auVar91._8_4_ * auVar75._8_4_);
      uVar101 = auVar62._12_4_;
      auVar134._12_4_ =
           uVar101 ^ (uint)(auVar69._12_4_ * auVar82._12_4_ +
                           auVar90._12_4_ * auVar81._12_4_ + auVar91._12_4_ * auVar75._12_4_);
      auVar62 = vcmpps_avx(auVar134,_DAT_01f45a50,5);
      auVar81 = auVar70 & auVar62;
      local_18a8 = (float)*(undefined8 *)(ray + 0x30);
      fStack_18a4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_18a0 = (float)*(undefined8 *)(ray + 0x38);
      fStack_189c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_18b8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_18b4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_18b0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_18ac = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar81[0xf] < '\0'
         ) {
        auVar81 = vpermilps_avx(ZEXT416((uint)fVar10),0);
        auVar75 = vpermilps_avx(ZEXT416((uint)fVar11),0);
        auVar69 = vpermilps_avx(ZEXT416((uint)fVar12),0);
        auVar62 = vandps_avx(auVar62,auVar70);
        auVar78._0_4_ =
             uVar23 ^ (uint)(auVar81._0_4_ * auVar82._0_4_ +
                            auVar69._0_4_ * auVar91._0_4_ + auVar90._0_4_ * auVar75._0_4_);
        auVar78._4_4_ =
             uVar99 ^ (uint)(auVar81._4_4_ * auVar82._4_4_ +
                            auVar69._4_4_ * auVar91._4_4_ + auVar90._4_4_ * auVar75._4_4_);
        auVar78._8_4_ =
             uVar100 ^ (uint)(auVar81._8_4_ * auVar82._8_4_ +
                             auVar69._8_4_ * auVar91._8_4_ + auVar90._8_4_ * auVar75._8_4_);
        auVar78._12_4_ =
             uVar101 ^ (uint)(auVar81._12_4_ * auVar82._12_4_ +
                             auVar69._12_4_ * auVar91._12_4_ + auVar90._12_4_ * auVar75._12_4_);
        auVar81 = vcmpps_avx(auVar78,_DAT_01f45a50,5);
        auVar75 = auVar62 & auVar81;
        if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar75[0xf] < '\0') {
          auVar49._8_4_ = 0x7fffffff;
          auVar49._0_8_ = 0x7fffffff7fffffff;
          auVar49._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar131,auVar49);
          auVar62 = vandps_avx(auVar81,auVar62);
          auVar81 = vsubps_avx(auVar75,auVar134);
          auVar81 = vcmpps_avx(auVar81,auVar78,5);
          auVar69 = auVar62 & auVar81;
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') {
            auVar62 = vandps_avx(auVar81,auVar62);
            auVar42._0_4_ =
                 uVar23 ^ (uint)(fVar79 * auVar92._0_4_ +
                                auVar40._0_4_ * fVar66 + fVar57 * auVar76._0_4_);
            auVar42._4_4_ =
                 uVar99 ^ (uint)(fVar86 * auVar92._4_4_ +
                                auVar40._4_4_ * fVar68 + fVar63 * auVar76._4_4_);
            auVar42._8_4_ =
                 uVar100 ^ (uint)(fVar58 * auVar92._8_4_ +
                                 auVar40._8_4_ * fVar80 + fVar65 * auVar76._8_4_);
            auVar42._12_4_ =
                 uVar101 ^ (uint)(fVar64 * auVar92._12_4_ +
                                 auVar40._12_4_ * fVar87 + fVar67 * auVar76._12_4_);
            auVar74._0_4_ = auVar75._0_4_ * local_18a8;
            auVar74._4_4_ = auVar75._4_4_ * fStack_18a4;
            auVar74._8_4_ = auVar75._8_4_ * fStack_18a0;
            auVar74._12_4_ = auVar75._12_4_ * fStack_189c;
            auVar76 = vcmpps_avx(auVar74,auVar42,1);
            auVar50._0_4_ = auVar75._0_4_ * local_18b8;
            auVar50._4_4_ = auVar75._4_4_ * fStack_18b4;
            auVar50._8_4_ = auVar75._8_4_ * fStack_18b0;
            auVar50._12_4_ = auVar75._12_4_ * fStack_18ac;
            auVar40 = vcmpps_avx(auVar42,auVar50,2);
            auVar76 = vandps_avx(auVar40,auVar76);
            auVar40 = auVar62 & auVar76;
            if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar40[0xf] < '\0') {
              auVar62 = vandps_avx(auVar76,auVar62);
              auVar76 = vcmpps_avx(auVar131,_DAT_01f45a50,4);
              auVar40 = auVar62 & auVar76;
              if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar40[0xf] < '\0') {
                auVar62 = vandps_avx(auVar76,auVar62);
                uVar23 = ((context->scene->geometries).items[uVar30].ptr)->mask;
                auVar51._4_4_ = uVar23;
                auVar51._0_4_ = uVar23;
                auVar51._8_4_ = uVar23;
                auVar51._12_4_ = uVar23;
                auVar76 = vandps_avx(auVar51,*(undefined1 (*) [16])(ray + 0x90));
                auVar76 = vpcmpeqd_avx(auVar76,_DAT_01f45a50);
                auVar40 = auVar62 & ~auVar76;
                if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar40[0xf] < '\0') {
                  auVar62 = vandnps_avx(auVar76,auVar62);
                  auVar70 = vandnps_avx(auVar62,auVar70);
                }
              }
            }
          }
        }
      }
      if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar70[0xf])
      {
        auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      uVar24 = *(undefined4 *)(lVar32 + -0x50 + lVar29);
      auVar60._4_4_ = uVar24;
      auVar60._0_4_ = uVar24;
      auVar60._8_4_ = uVar24;
      auVar60._12_4_ = uVar24;
      uVar24 = *(undefined4 *)(lVar32 + -0x40 + lVar29);
      auVar85._4_4_ = uVar24;
      auVar85._0_4_ = uVar24;
      auVar85._8_4_ = uVar24;
      auVar85._12_4_ = uVar24;
      uVar24 = *(undefined4 *)(lVar32 + -0x30 + lVar29);
      auVar94._4_4_ = uVar24;
      auVar94._0_4_ = uVar24;
      auVar94._8_4_ = uVar24;
      auVar94._12_4_ = uVar24;
      auVar19._4_4_ = fVar9;
      auVar19._0_4_ = fVar9;
      auVar19._8_4_ = fVar9;
      auVar19._12_4_ = fVar9;
      auVar62 = vsubps_avx(auVar60,auVar19);
      auVar18._4_4_ = fVar1;
      auVar18._0_4_ = fVar1;
      auVar18._8_4_ = fVar1;
      auVar18._12_4_ = fVar1;
      auVar76 = vsubps_avx(auVar85,auVar18);
      auVar17._4_4_ = fVar2;
      auVar17._0_4_ = fVar2;
      auVar17._8_4_ = fVar2;
      auVar17._12_4_ = fVar2;
      auVar40 = vsubps_avx(auVar94,auVar17);
      auVar81 = vsubps_avx(_local_18f8,auVar60);
      auVar75 = vsubps_avx(_local_1908,auVar85);
      auVar69 = vsubps_avx(_local_1918,auVar94);
      fVar6 = auVar76._0_4_;
      fVar136 = auVar69._0_4_;
      auVar41._0_4_ = fVar136 * fVar6;
      fVar1 = auVar76._4_4_;
      fVar137 = auVar69._4_4_;
      auVar41._4_4_ = fVar137 * fVar1;
      fVar12 = auVar76._8_4_;
      fVar138 = auVar69._8_4_;
      auVar41._8_4_ = fVar138 * fVar12;
      fVar67 = auVar76._12_4_;
      fVar139 = auVar69._12_4_;
      auVar41._12_4_ = fVar139 * fVar67;
      fVar7 = auVar40._0_4_;
      fVar121 = auVar75._0_4_;
      auVar47._0_4_ = fVar121 * fVar7;
      fVar2 = auVar40._4_4_;
      fVar127 = auVar75._4_4_;
      auVar47._4_4_ = fVar127 * fVar2;
      fVar57 = auVar40._8_4_;
      fVar128 = auVar75._8_4_;
      auVar47._8_4_ = fVar128 * fVar57;
      fVar79 = auVar40._12_4_;
      fVar129 = auVar75._12_4_;
      auVar47._12_4_ = fVar129 * fVar79;
      auVar76 = vsubps_avx(auVar47,auVar41);
      fVar113 = auVar81._0_4_;
      auVar48._0_4_ = fVar113 * fVar7;
      fVar118 = auVar81._4_4_;
      auVar48._4_4_ = fVar118 * fVar2;
      fVar119 = auVar81._8_4_;
      auVar48._8_4_ = fVar119 * fVar57;
      fVar120 = auVar81._12_4_;
      auVar48._12_4_ = fVar120 * fVar79;
      fVar8 = auVar62._0_4_;
      auVar72._0_4_ = fVar136 * fVar8;
      fVar10 = auVar62._4_4_;
      auVar72._4_4_ = fVar137 * fVar10;
      fVar63 = auVar62._8_4_;
      auVar72._8_4_ = fVar138 * fVar63;
      fVar86 = auVar62._12_4_;
      auVar72._12_4_ = fVar139 * fVar86;
      auVar40 = vsubps_avx(auVar72,auVar48);
      auVar73._0_4_ = fVar121 * fVar8;
      auVar73._4_4_ = fVar127 * fVar10;
      auVar73._8_4_ = fVar128 * fVar63;
      auVar73._12_4_ = fVar129 * fVar86;
      auVar105._0_4_ = fVar113 * fVar6;
      auVar105._4_4_ = fVar118 * fVar1;
      auVar105._8_4_ = fVar119 * fVar12;
      auVar105._12_4_ = fVar120 * fVar67;
      auVar81 = vsubps_avx(auVar105,auVar73);
      auVar62 = vsubps_avx(auVar60,*(undefined1 (*) [16])ray);
      auVar75 = vsubps_avx(auVar85,*(undefined1 (*) [16])(ray + 0x10));
      auVar69 = vsubps_avx(auVar94,*(undefined1 (*) [16])(ray + 0x20));
      fVar107 = auVar69._0_4_;
      auVar95._0_4_ = fVar107 * local_1878;
      fVar110 = auVar69._4_4_;
      auVar95._4_4_ = fVar110 * fStack_1874;
      fVar111 = auVar69._8_4_;
      auVar95._8_4_ = fVar111 * fStack_1870;
      fVar112 = auVar69._12_4_;
      auVar95._12_4_ = fVar112 * fStack_186c;
      fVar80 = auVar75._0_4_;
      auVar132._0_4_ = fVar80 * local_1888;
      fVar87 = auVar75._4_4_;
      auVar132._4_4_ = fVar87 * fStack_1884;
      fVar88 = auVar75._8_4_;
      auVar132._8_4_ = fVar88 * fStack_1880;
      fVar89 = auVar75._12_4_;
      auVar132._12_4_ = fVar89 * fStack_187c;
      auVar75 = vsubps_avx(auVar132,auVar95);
      fVar58 = auVar62._0_4_;
      auVar96._0_4_ = fVar58 * local_1888;
      fVar64 = auVar62._4_4_;
      auVar96._4_4_ = fVar64 * fStack_1884;
      fVar66 = auVar62._8_4_;
      auVar96._8_4_ = fVar66 * fStack_1880;
      fVar68 = auVar62._12_4_;
      auVar96._12_4_ = fVar68 * fStack_187c;
      fVar9 = auVar20._0_4_;
      auVar133._0_4_ = fVar107 * fVar9;
      fVar11 = auVar20._4_4_;
      auVar133._4_4_ = fVar110 * fVar11;
      fVar65 = auVar20._8_4_;
      auVar133._8_4_ = fVar111 * fVar65;
      auVar133._12_4_ = fVar112 * fStack_188c;
      auVar69 = vsubps_avx(auVar133,auVar96);
      auVar97._0_4_ = fVar80 * fVar9;
      auVar97._4_4_ = fVar87 * fVar11;
      auVar97._8_4_ = fVar88 * fVar65;
      auVar97._12_4_ = fVar89 * fStack_188c;
      auVar135._0_4_ = fVar58 * local_1878;
      auVar135._4_4_ = fVar64 * fStack_1874;
      auVar135._8_4_ = fVar66 * fStack_1870;
      auVar135._12_4_ = fVar68 * fStack_186c;
      auVar82 = vsubps_avx(auVar135,auVar97);
      auVar98._0_4_ =
           auVar76._0_4_ * fVar9 + auVar40._0_4_ * local_1878 + auVar81._0_4_ * local_1888;
      auVar98._4_4_ =
           auVar76._4_4_ * fVar11 + auVar40._4_4_ * fStack_1874 + auVar81._4_4_ * fStack_1884;
      auVar98._8_4_ =
           auVar76._8_4_ * fVar65 + auVar40._8_4_ * fStack_1870 + auVar81._8_4_ * fStack_1880;
      auVar98._12_4_ =
           auVar76._12_4_ * fStack_188c +
           auVar40._12_4_ * fStack_186c + auVar81._12_4_ * fStack_187c;
      auVar125._8_4_ = 0x80000000;
      auVar125._0_8_ = 0x8000000080000000;
      auVar125._12_4_ = 0x80000000;
      auVar62 = vandps_avx(auVar125,auVar98);
      uVar23 = auVar62._0_4_;
      auVar116._0_4_ =
           uVar23 ^ (uint)(fVar113 * auVar75._0_4_ +
                          fVar121 * auVar69._0_4_ + fVar136 * auVar82._0_4_);
      uVar99 = auVar62._4_4_;
      auVar116._4_4_ =
           uVar99 ^ (uint)(fVar118 * auVar75._4_4_ +
                          fVar127 * auVar69._4_4_ + fVar137 * auVar82._4_4_);
      uVar100 = auVar62._8_4_;
      auVar116._8_4_ =
           uVar100 ^ (uint)(fVar119 * auVar75._8_4_ +
                           fVar128 * auVar69._8_4_ + fVar138 * auVar82._8_4_);
      uVar101 = auVar62._12_4_;
      auVar116._12_4_ =
           uVar101 ^ (uint)(fVar120 * auVar75._12_4_ +
                           fVar129 * auVar69._12_4_ + fVar139 * auVar82._12_4_);
      auVar62 = vcmpps_avx(auVar116,_DAT_01f45a50,5);
      auVar90 = auVar70 & auVar62;
      if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar90[0xf] < '\0'
         ) {
        auVar62 = vandps_avx(auVar62,auVar70);
        auVar106._0_4_ =
             uVar23 ^ (uint)(auVar75._0_4_ * fVar8 + auVar69._0_4_ * fVar6 + auVar82._0_4_ * fVar7);
        auVar106._4_4_ =
             uVar99 ^ (uint)(auVar75._4_4_ * fVar10 + auVar69._4_4_ * fVar1 + auVar82._4_4_ * fVar2)
        ;
        auVar106._8_4_ =
             uVar100 ^ (uint)(auVar75._8_4_ * fVar63 +
                             auVar69._8_4_ * fVar12 + auVar82._8_4_ * fVar57);
        auVar106._12_4_ =
             uVar101 ^ (uint)(auVar75._12_4_ * fVar86 +
                             auVar69._12_4_ * fVar67 + auVar82._12_4_ * fVar79);
        auVar75 = vcmpps_avx(auVar106,_DAT_01f45a50,5);
        auVar69 = auVar62 & auVar75;
        if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar69[0xf] < '\0') {
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar69 = vandps_avx(auVar98,auVar43);
          auVar62 = vandps_avx(auVar75,auVar62);
          auVar75 = vsubps_avx(auVar69,auVar116);
          auVar75 = vcmpps_avx(auVar75,auVar106,5);
          auVar82 = auVar62 & auVar75;
          if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar82[0xf] < '\0') {
            auVar62 = vandps_avx(auVar75,auVar62);
            auVar44._0_4_ =
                 uVar23 ^ (uint)(fVar58 * auVar76._0_4_ +
                                fVar107 * auVar81._0_4_ + fVar80 * auVar40._0_4_);
            auVar44._4_4_ =
                 uVar99 ^ (uint)(fVar64 * auVar76._4_4_ +
                                fVar110 * auVar81._4_4_ + fVar87 * auVar40._4_4_);
            auVar44._8_4_ =
                 uVar100 ^ (uint)(fVar66 * auVar76._8_4_ +
                                 fVar111 * auVar81._8_4_ + fVar88 * auVar40._8_4_);
            auVar44._12_4_ =
                 uVar101 ^ (uint)(fVar68 * auVar76._12_4_ +
                                 fVar112 * auVar81._12_4_ + fVar89 * auVar40._12_4_);
            auVar52._0_4_ = auVar69._0_4_ * local_18a8;
            auVar52._4_4_ = auVar69._4_4_ * fStack_18a4;
            auVar52._8_4_ = auVar69._8_4_ * fStack_18a0;
            auVar52._12_4_ = auVar69._12_4_ * fStack_189c;
            auVar76 = vcmpps_avx(auVar52,auVar44,1);
            auVar61._0_4_ = auVar69._0_4_ * local_18b8;
            auVar61._4_4_ = auVar69._4_4_ * fStack_18b4;
            auVar61._8_4_ = auVar69._8_4_ * fStack_18b0;
            auVar61._12_4_ = auVar69._12_4_ * fStack_18ac;
            auVar40 = vcmpps_avx(auVar44,auVar61,2);
            auVar76 = vandps_avx(auVar40,auVar76);
            auVar40 = auVar62 & auVar76;
            if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar40[0xf] < '\0') {
              auVar62 = vandps_avx(auVar62,auVar76);
              auVar76 = vcmpps_avx(auVar98,_DAT_01f45a50,4);
              auVar40 = auVar62 & auVar76;
              if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar40[0xf] < '\0') {
                auVar62 = vandps_avx(auVar76,auVar62);
                uVar23 = ((context->scene->geometries).items[uVar30].ptr)->mask;
                auVar53._4_4_ = uVar23;
                auVar53._0_4_ = uVar23;
                auVar53._8_4_ = uVar23;
                auVar53._12_4_ = uVar23;
                auVar76 = vandps_avx(auVar53,*(undefined1 (*) [16])(ray + 0x90));
                auVar76 = vpcmpeqd_avx(auVar76,_DAT_01f45a50);
                auVar40 = auVar62 & ~auVar76;
                if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar40[0xf] < '\0') {
                  auVar62 = vandnps_avx(auVar76,auVar62);
                  auVar70 = vandnps_avx(auVar62,auVar70);
                }
              }
            }
          }
        }
      }
      auVar117 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      lVar29 = lVar29 + 4;
    } while ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar70[0xf] < '\0');
    auVar56 = ZEXT1664(local_1948);
    auVar76 = vandps_avx(auVar70,local_1948);
    lVar26 = lVar26 + 1;
    lVar32 = lVar32 + 0xe0;
    auVar70 = local_1948 & auVar70;
    auVar62 = local_1948;
    local_1948 = auVar76;
  } while ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar70[0xf] < '\0');
  auVar62 = vpcmpeqd_avx(auVar62,auVar62);
  auVar45._0_4_ = local_1948._0_4_ ^ auVar62._0_4_;
  auVar45._4_4_ = local_1948._4_4_ ^ auVar62._4_4_;
  auVar45._8_4_ = local_1948._8_4_ ^ auVar62._8_4_;
  auVar45._12_4_ = local_1948._12_4_ ^ auVar62._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar45,(undefined1  [16])terminated.field_0);
  auVar62 = auVar62 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar62[0xf])
  goto LAB_00ebe34b;
  auVar54._8_4_ = 0xff800000;
  auVar54._0_8_ = 0xff800000ff800000;
  auVar54._12_4_ = 0xff800000;
  auVar56 = ZEXT1664(auVar54);
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar54,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ebd965;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }